

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  int local_2c;
  int rc;
  i64 iFrom_local;
  int bFromValid_local;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  local_2c = (*pNode->apChild[0]->xNext)(pExpr,pNode->apChild[0],bFromValid,iFrom);
  if (local_2c == 0) {
    local_2c = fts5ExprNodeTest_NOT(pExpr,pNode);
  }
  if (local_2c != 0) {
    pNode->bNomatch = 0;
  }
  return local_2c;
}

Assistant:

static int fts5ExprNodeNext_NOT(
  Fts5Expr *pExpr, 
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc = fts5ExprNodeNext(pExpr, pNode->apChild[0], bFromValid, iFrom);
  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest_NOT(pExpr, pNode);
  }
  if( rc!=SQLITE_OK ){
    pNode->bNomatch = 0;
  }
  return rc;
}